

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastpack15(uint64_t *in,uint32_t *out)

{
  Unroller<(unsigned_short)15,_(unsigned_short)0>::Pack(in,out);
  return;
}

Assistant:

void __fastpack15(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<15>::Pack(in, out);
}